

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

string * __thiscall
flatbuffers::ts::TsGenerator::GenObjApiUnionTypeTS
          (string *__return_storage_ptr__,TsGenerator *this,import_set *imports,StructDef *dependent
          ,IDLOptions *param_3,EnumDef *union_enum)

{
  long lVar1;
  _Base_ptr p_Var2;
  long *plVar3;
  char *__end;
  string type;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  type_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  TsGenerator *local_140;
  import_set *local_138;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  undefined1 local_100 [160];
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  local_148 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_148;
  local_140 = this;
  local_138 = imports;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_130._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130._M_impl.super__Rb_tree_header._M_header;
  local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
  plVar3 = (long *)(param_3->go_namespace)._M_dataplus._M_p;
  local_130._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130._M_impl.super__Rb_tree_header._M_header._M_left;
  if (plVar3 != (long *)(param_3->go_namespace)._M_string_length) {
    do {
      lVar1 = *plVar3;
      if (*(long *)(lVar1 + 0xa0) != 0) {
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"","");
        if (*(int *)(lVar1 + 0x38) == 0xf) {
          AddImport<flatbuffers::StructDef>
                    ((ImportDefinition *)local_100,local_140,local_138,&dependent->super_Definition,
                     *(StructDef **)(lVar1 + 0x40));
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_p != local_50) {
            operator_delete(local_60._M_p,local_50[0]._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_100._128_8_ != local_100 + 0x90) {
            operator_delete((void *)local_100._128_8_,local_100._144_8_ + 1);
          }
          if ((undefined1 *)local_100._96_8_ != local_100 + 0x70) {
            operator_delete((void *)local_100._96_8_,local_100._112_8_ + 1);
          }
          if ((undefined1 *)local_100._64_8_ != local_100 + 0x50) {
            operator_delete((void *)local_100._64_8_,local_100._80_8_ + 1);
          }
          if ((undefined1 *)local_100._32_8_ != local_100 + 0x30) {
            operator_delete((void *)local_100._32_8_,local_100._48_8_ + 1);
          }
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
            operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
          }
        }
        else {
          if (*(int *)(lVar1 + 0x38) != 0xd) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_ts.cpp"
                          ,0x3c4,
                          "std::string flatbuffers::ts::TsGenerator::GenObjApiUnionTypeTS(import_set &, const StructDef &, const IDLOptions &, const EnumDef &)"
                         );
          }
          std::__cxx11::string::_M_replace
                    ((ulong)&local_168,0,(char *)local_168._M_string_length,0x388f64);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_130,&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
      }
      plVar3 = plVar3 + 1;
    } while (plVar3 != (long *)(param_3->go_namespace)._M_string_length);
  }
  if ((_Rb_tree_header *)local_130._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_130._M_impl.super__Rb_tree_header) {
    p_Var2 = local_130._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_100,*(long *)(p_Var2 + 1),
                 (long)&(p_Var2[1]._M_parent)->_M_color + *(long *)(p_Var2 + 1));
      std::__cxx11::string::append((char *)local_100);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_100._0_8_);
      if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != &local_130._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string GenObjApiUnionTypeTS(import_set &imports,
                                   const StructDef &dependent,
                                   const IDLOptions &,
                                   const EnumDef &union_enum) {
    std::string ret = "";
    std::set<std::string> type_list;

    for (auto it = union_enum.Vals().begin(); it != union_enum.Vals().end();
         ++it) {
      const auto &ev = **it;
      if (ev.IsZero()) { continue; }

      std::string type = "";
      if (IsString(ev.union_type)) {
        type = "string";  // no need to wrap string type in namespace
      } else if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
        type = AddImport(imports, dependent, *ev.union_type.struct_def)
                   .object_name;
      } else {
        FLATBUFFERS_ASSERT(false);
      }
      type_list.insert(type);
    }

    size_t totalPrinted = 0;
    for (auto it = type_list.begin(); it != type_list.end(); ++it) {
      ++totalPrinted;
      ret += *it + ((totalPrinted == type_list.size()) ? "" : "|");
    }

    return ret;
  }